

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O1

void ur_kinematics::forward(double *q,double *T)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = sin(*q);
  dVar2 = cos(*q);
  dVar5 = q[1];
  dVar3 = sin(dVar5);
  dVar4 = cos(q[1]);
  sin(q[2]);
  cos(q[2]);
  dVar5 = dVar5 + q[2];
  dVar6 = sin(q[3]);
  dVar7 = cos(q[3]);
  dVar15 = q[3];
  dVar8 = sin(q[4]);
  dVar9 = cos(q[4]);
  dVar10 = sin(q[5]);
  dVar11 = cos(q[5]);
  dVar12 = sin(dVar5);
  dVar13 = cos(dVar5);
  dVar14 = sin(dVar15 + dVar5);
  dVar5 = cos(dVar15 + dVar5);
  *T = dVar2 * dVar5 * dVar8 - dVar1 * dVar9;
  dVar16 = dVar1 * dVar8 + dVar9 * dVar2 * dVar5;
  dVar15 = dVar2 * -dVar14;
  T[1] = dVar11 * dVar16 + dVar10 * dVar15;
  T[2] = dVar15 * dVar11 - dVar16 * dVar10;
  T[3] = dVar1 * -0.1333 +
         dVar14 * -0.0997 * dVar2 +
         dVar9 * -0.0996 * dVar1 +
         dVar2 * 0.425 * dVar4 + dVar5 * 0.0996 * dVar2 * dVar8 + dVar2 * dVar13 * 0.3922;
  dVar16 = dVar2 * dVar9 + dVar1 * dVar5 * dVar8;
  dVar15 = dVar2 * dVar8 - dVar9 * dVar5 * dVar1;
  T[4] = dVar16;
  T[5] = -dVar11 * dVar15 - dVar1 * dVar14 * dVar10;
  T[6] = dVar15 * dVar10 - dVar11 * dVar14 * dVar1;
  T[7] = dVar14 * -0.0997 * dVar1 +
         dVar4 * 0.425 * dVar1 + dVar13 * 0.3922 * dVar1 + dVar16 * 0.0996 + dVar2 * 0.1333;
  T[8] = -dVar14 * dVar8;
  T[9] = -dVar5 * dVar10 - dVar11 * dVar9 * dVar14;
  T[10] = dVar9 * dVar14 * dVar10 - dVar11 * dVar5;
  T[0xb] = dVar8 * -0.0996 * (dVar13 * dVar6 + dVar7 * dVar12) +
           (dVar13 * dVar7 - dVar6 * dVar12) * -0.0997 + dVar3 * -0.425 + dVar12 * -0.3922 + 0.1625;
  T[0xc] = 0.0;
  T[0xd] = 0.0;
  T[0xe] = 0.0;
  T[0xf] = 1.0;
  return;
}

Assistant:

void forward(const double* q, double* T) {
    double s1 = sin(*q), c1 = cos(*q); q++;
    double q23 = *q, q234 = *q, s2 = sin(*q), c2 = cos(*q); q++;
    double s3 = sin(*q), c3 = cos(*q); q23 += *q; q234 += *q; q++;
    double s4 = sin(*q), c4 = cos(*q); q234 += *q; q++;
    double s5 = sin(*q), c5 = cos(*q); q++;
    double s6 = sin(*q), c6 = cos(*q);
    double s23 = sin(q23), c23 = cos(q23);
    double s234 = sin(q234), c234 = cos(q234);
    *T = c234*c1*s5 - c5*s1; T++;
    *T = c6*(s1*s5 + c234*c1*c5) - s234*c1*s6; T++;
    *T = -s6*(s1*s5 + c234*c1*c5) - s234*c1*c6; T++;
    *T = d6*c234*c1*s5 - a3*c23*c1 - a2*c1*c2 - d6*c5*s1 - d5*s234*c1 - d4*s1; T++;
    *T = c1*c5 + c234*s1*s5; T++;
    *T = -c6*(c1*s5 - c234*c5*s1) - s234*s1*s6; T++;
    *T = s6*(c1*s5 - c234*c5*s1) - s234*c6*s1; T++;
    *T = d6*(c1*c5 + c234*s1*s5) + d4*c1 - a3*c23*s1 - a2*c2*s1 - d5*s234*s1; T++;
    *T = -s234*s5; T++;
    *T = -c234*s6 - s234*c5*c6; T++;
    *T = s234*c5*s6 - c234*c6; T++;
    *T = d1 + a3*s23 + a2*s2 - d5*(c23*c4 - s23*s4) - d6*s5*(c23*s4 + s23*c4); T++;
    *T = 0.0; T++; *T = 0.0; T++; *T = 0.0; T++; *T = 1.0;
  }